

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLHarnessHandlers.cpp
# Opt level: O1

void __thiscall
XMLHarnessHandlers::XMLHarnessHandlers(XMLHarnessHandlers *this,XMLCh *baseURL,XMLCh *scanner)

{
  RefVectorOf<xercesc_4_0::XMLURL> *this_00;
  XMLSize_t XVar1;
  MemoryManager *pMVar2;
  XMLSize_t index;
  XMLCh *pXVar3;
  XMLURL **ppXVar4;
  long lVar5;
  SAX2XMLReader *pSVar6;
  XMLURL *this_01;
  BaseErrorHandler *pBVar7;
  
  BaseHarnessHandlers::BaseHarnessHandlers(&this->super_BaseHarnessHandlers,baseURL);
  (this->super_BaseHarnessHandlers).super_DefaultHandler.super_EntityResolver._vptr_EntityResolver =
       (_func_int **)&PTR__XMLHarnessHandlers_00112a00;
  (this->super_BaseHarnessHandlers).super_DefaultHandler.super_DTDHandler._vptr_DTDHandler =
       (_func_int **)&PTR__XMLHarnessHandlers_00112b18;
  (this->super_BaseHarnessHandlers).super_DefaultHandler.super_ContentHandler._vptr_ContentHandler =
       (_func_int **)&PTR__XMLHarnessHandlers_00112b50;
  (this->super_BaseHarnessHandlers).super_DefaultHandler.super_ErrorHandler._vptr_ErrorHandler =
       (_func_int **)&PTR__XMLHarnessHandlers_00112bc8;
  (this->super_BaseHarnessHandlers).super_DefaultHandler.super_LexicalHandler._vptr_LexicalHandler =
       (_func_int **)&PTR__XMLHarnessHandlers_00112c08;
  (this->super_BaseHarnessHandlers).super_DefaultHandler.super_DeclHandler._vptr_DeclHandler =
       (_func_int **)&PTR__XMLHarnessHandlers_00112c60;
  (this->fErrorHandler).super_ErrorHandler._vptr_ErrorHandler =
       (_func_int **)&PTR__BaseErrorHandler_00111d78;
  (this->fErrorHandler).fSawErrors = false;
  pMVar2 = xercesc_4_0::XMLPlatformUtils::fgMemoryManager;
  (this->fErrorHandler).fErrorText.fIndex = 0;
  (this->fErrorHandler).fErrorText.fCapacity = 0x3ff;
  (this->fErrorHandler).fErrorText.fFullSize = 0;
  (this->fErrorHandler).fErrorText.fUsed = false;
  (this->fErrorHandler).fErrorText.fMemoryManager = pMVar2;
  (this->fErrorHandler).fErrorText.fFullHandler = (XMLBufferFullHandler *)0x0;
  (this->fErrorHandler).fErrorText.fBuffer = (XMLCh *)0x0;
  pXVar3 = (XMLCh *)(**(code **)(*(long *)pMVar2 + 0x18))(pMVar2,0x800);
  pBVar7 = &this->fErrorHandler;
  (this->fErrorHandler).fErrorText.fBuffer = pXVar3;
  *pXVar3 = L'\0';
  pMVar2 = xercesc_4_0::XMLPlatformUtils::fgMemoryManager;
  (this->fTestBaseURL).fVector.super_BaseRefVectorOf<xercesc_4_0::XMLURL>._vptr_BaseRefVectorOf =
       (_func_int **)&PTR__BaseRefVectorOf_00112970;
  (this->fTestBaseURL).fVector.super_BaseRefVectorOf<xercesc_4_0::XMLURL>.fAdoptedElems = true;
  (this->fTestBaseURL).fVector.super_BaseRefVectorOf<xercesc_4_0::XMLURL>.fCurCount = 0;
  (this->fTestBaseURL).fVector.super_BaseRefVectorOf<xercesc_4_0::XMLURL>.fMaxCount = 5;
  (this->fTestBaseURL).fVector.super_BaseRefVectorOf<xercesc_4_0::XMLURL>.fElemList = (XMLURL **)0x0
  ;
  (this->fTestBaseURL).fVector.super_BaseRefVectorOf<xercesc_4_0::XMLURL>.fMemoryManager = pMVar2;
  ppXVar4 = (XMLURL **)(**(code **)(*(long *)pMVar2 + 0x18))();
  this_00 = &(this->fTestBaseURL).fVector;
  (this->fTestBaseURL).fVector.super_BaseRefVectorOf<xercesc_4_0::XMLURL>.fElemList = ppXVar4;
  lVar5 = 0;
  do {
    (this->fTestBaseURL).fVector.super_BaseRefVectorOf<xercesc_4_0::XMLURL>.fElemList[lVar5] =
         (XMLURL *)0x0;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 5);
  (this_00->super_BaseRefVectorOf<xercesc_4_0::XMLURL>)._vptr_BaseRefVectorOf =
       (_func_int **)&PTR__RefVectorOf_001128f8;
  pSVar6 = (SAX2XMLReader *)
           xercesc_4_0::XMLReaderFactory::createXMLReader
                     (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,(XMLGrammarPool *)0x0);
  this->fParser = pSVar6;
  (*pSVar6->_vptr_SAX2XMLReader[0xd])(pSVar6,&xercesc_4_0::XMLUni::fgXercesScannerName,scanner);
  (*this->fParser->_vptr_SAX2XMLReader[0xc])
            (this->fParser,&xercesc_4_0::XMLUni::fgSAX2CoreValidation,1);
  (*this->fParser->_vptr_SAX2XMLReader[0xc])(this->fParser,&xercesc_4_0::XMLUni::fgXercesDynamic,0);
  (*this->fParser->_vptr_SAX2XMLReader[0xb])();
  this_01 = (XMLURL *)xercesc_4_0::XMemory::operator_new((XMemory *)0x58,(ulong)pBVar7);
  xercesc_4_0::XMLURL::XMLURL(this_01,&(this->super_BaseHarnessHandlers).fBaseURL);
  xercesc_4_0::BaseRefVectorOf<xercesc_4_0::XMLURL>::ensureExtraCapacity
            (&this_00->super_BaseRefVectorOf<xercesc_4_0::XMLURL>,1);
  XVar1 = (this->fTestBaseURL).fVector.super_BaseRefVectorOf<xercesc_4_0::XMLURL>.fCurCount;
  (this->fTestBaseURL).fVector.super_BaseRefVectorOf<xercesc_4_0::XMLURL>.fElemList[XVar1] = this_01
  ;
  (this->fTestBaseURL).fVector.super_BaseRefVectorOf<xercesc_4_0::XMLURL>.fCurCount = XVar1 + 1;
  return;
}

Assistant:

XMLHarnessHandlers::XMLHarnessHandlers(const XMLCh* baseURL, const XMLCh* scanner) : BaseHarnessHandlers(baseURL)
, fTestBaseURL(5)
{
    fParser = XMLReaderFactory::createXMLReader();
    fParser->setProperty(XMLUni::fgXercesScannerName, (void*)scanner);
    fParser->setFeature(XMLUni::fgSAX2CoreValidation, true);
    fParser->setFeature(XMLUni::fgXercesDynamic, false);
    fParser->setErrorHandler(&fErrorHandler);
    
    fTestBaseURL.push(new XMLURL(fBaseURL));
}